

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdtFunc.h
# Opt level: O2

int SDT::getTypeWidth(string *type)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  int iVar4;
  ostream *poVar5;
  size_type sVar6;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> t;
  
  pcVar3 = (type->_M_dataplus)._M_p;
  cVar1 = *pcVar3;
  switch(cVar1) {
  case 'a':
    divideType(&t,type);
    iVar4 = getTypeWidth(&t.second);
    iVar4 = iVar4 * t.first;
    std::__cxx11::string::~string((string *)&t.second);
    break;
  case 'c':
    iVar4 = 1;
    break;
  case 'd':
    iVar4 = 8;
    break;
  case 'f':
  case 'i':
    iVar4 = 4;
    break;
  default:
    if (cVar1 == 's') {
      iVar4 = 0;
      for (sVar6 = 0; type->_M_string_length != sVar6; sVar6 = sVar6 + 1) {
        bVar2 = pcVar3[sVar6];
        if ((byte)(bVar2 - 0x30) < 10) {
          iVar4 = iVar4 * 10 + -0x30 + (uint)bVar2;
        }
      }
      return iVar4;
    }
  case 'b':
  case 'e':
  case 'g':
  case 'h':
    poVar5 = std::operator<<((ostream *)&std::cout,"Get width of ");
    poVar5 = std::operator<<(poVar5,(string *)type);
    poVar5 = std::operator<<(poVar5," ERROR");
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int getTypeWidth(const string &type){
        if(type[0]=='i') return 4;
        if(type[0]=='c') return 1;
        if(type[0]=='f') return 4;
        if(type[0]=='d') return 8;
        if(type[0]=='a'){
            auto t = divideType(type);
            return t.first*getTypeWidth(t.second);
        }
        if(type[0]=='s'){
            int num = 0;
            for(char t:type){
                if(t>='0'&&t<='9') num = num*10 + (t-'0');
            }
            return num;
        }
        cout<<"Get width of "<<type<<" ERROR"<<endl;
        return -1;
    }